

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::texture::anon_unknown_0::TextureCubeMipmapTestInstance::iterate
          (TestStatus *__return_storage_ptr__,TextureCubeMipmapTestInstance *this)

{
  TextureRenderer *this_00;
  deUint32 *this_01;
  CoordType CVar1;
  int iVar2;
  int width;
  int height;
  TestLog *pTVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  int iVar6;
  int iVar7;
  TextureFormat format;
  ulong uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Surface *pSVar10;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  void *pvVar14;
  bool bVar15;
  int local_4c4;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> gridLayout;
  undefined1 local_488 [40];
  deUint32 local_460;
  deUint32 local_45c;
  float local_458;
  float local_454;
  undefined1 local_450 [40];
  vector<float,_std::allocator<float>_> texCoord;
  undefined1 local_410 [40];
  PixelFormat local_3e8;
  undefined1 local_3d0 [44];
  LodPrecision lodPrec;
  Surface referenceFrame;
  Surface renderedFrame;
  Surface errorMask;
  LookupPrecision local_348;
  Random rnd;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  int local_2f8;
  undefined1 auStack_2f4 [84];
  ios_base local_2a0 [276];
  undefined1 local_18c [92];
  ConstPixelBufferAccess *pCStack_130;
  int local_128;
  bool local_114;
  undefined7 uStack_113;
  LodMode local_10c;
  Vector<int,_4> res;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8 [6];
  IVec4 formatBitDepth;
  PixelBufferAccess local_58;
  long lVar9;
  
  this_00 = &this->m_renderer;
  dVar4 = util::TextureRenderer::getRenderWidth(this_00);
  dVar5 = util::TextureRenderer::getRenderHeight(this_00);
  CVar1 = (this->m_testParameters).super_TextureMipmapCommonTestCaseParameters.coordType;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_18c,TEXTURETYPE_CUBE);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tcu::Surface::Surface(&renderedFrame,dVar4,dVar5);
  util::createSampler((Sampler *)&rnd,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapS,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapT,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter);
  local_128 = local_2f8;
  local_18c._84_8_ = local_308._M_allocated_capacity;
  pCStack_130 = (ConstPixelBufferAccess *)local_308._8_8_;
  local_18c._68_4_ = rnd.m_rnd.x;
  local_18c._72_4_ = rnd.m_rnd.y;
  local_18c._76_4_ = rnd.m_rnd.z;
  local_18c._80_4_ = rnd.m_rnd.w;
  format = ::vk::mapVkFormat((this->m_testParameters).super_TextureCubeTestCaseParameters.
                             super_TextureCommonTestCaseParameters.format);
  local_18c._4_4_ = glu::TextureTestUtil::getSamplerType(format);
  local_18c._8_4_ = (uint)(CVar1 == COORDTYPE_PROJECTED) + (uint)(CVar1 == COORDTYPE_BASIC_BIAS) * 2
  ;
  local_10c = LODMODE_EXACT;
  gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deRandom_init(&rnd.m_rnd,7);
  randomPartition(&gridLayout,&rnd,0,0,dVar4,dVar5);
  local_460 = dVar5;
  local_45c = dVar4;
  if (texture::(anonymous_namespace)::TextureCubeMipmapTestInstance::iterate()::s_projections ==
      '\0') {
    _GLOBAL__N_1::TextureCubeMipmapTestInstance::iterate();
  }
  if (0 < (int)((ulong)((long)gridLayout.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)gridLayout.
                             super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
    lVar11 = 0xc;
    uVar13 = 0;
    do {
      iVar7 = *(int *)((long)(gridLayout.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11 + -0xc);
      uVar12 = (uint)uVar13;
      iVar2 = *(int *)((long)(gridLayout.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11 + -8);
      local_454 = (float)*(int *)((long)(gridLayout.
                                         super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                 lVar11 + -4);
      local_458 = (float)*(int *)((long)(gridLayout.
                                         super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11
                                 );
      glu::TextureTestUtil::computeQuadTexCoordCube
                (&texCoord,uVar12 + (int)((uVar13 & 0xffffffff) / 6) * -6);
      if (CVar1 == COORDTYPE_PROJECTED) {
        local_18c._8_4_ = local_18c._8_4_ | 1;
        uVar8 = (ulong)((uVar12 & 3) << 4);
        local_18c._12_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + uVar8);
        local_18c._20_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + uVar8 + 8);
      }
      else if (CVar1 == COORDTYPE_BASIC_BIAS) {
        local_18c._8_4_ = local_18c._8_4_ | 2;
        local_18c._28_4_ = Texture2DMipmapTestInstance::iterate::s_bias[uVar12 & 7];
      }
      util::TextureRenderer::setViewport(this_00,(float)iVar7,(float)iVar2,local_454,local_458);
      util::TextureRenderer::renderQuad
                (this_00,&renderedFrame,0,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,(ReferenceParams *)local_18c);
      uVar13 = uVar13 + 1;
      lVar11 = lVar11 + 0x10;
    } while ((long)uVar13 <
             (long)(int)((ulong)((long)gridLayout.
                                       super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)gridLayout.
                                      super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4));
  }
  rnd.m_rnd._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::getTextureFormatBitDepth((tcu *)&formatBitDepth,(TextureFormat *)&rnd);
  dVar5 = local_45c;
  dVar4 = local_460;
  local_3e8.redBits = formatBitDepth.m_data[0];
  local_3e8.greenBits = formatBitDepth.m_data[1];
  local_3e8.blueBits = formatBitDepth.m_data[2];
  local_3e8.alphaBits = formatBitDepth.m_data[3];
  tcu::Surface::Surface(&referenceFrame,local_45c,local_460);
  tcu::Surface::Surface(&errorMask,dVar5,dVar4);
  local_348.coordBits.m_data[0] = 0x16;
  local_348.coordBits.m_data[1] = 0x16;
  local_348.coordBits.m_data[2] = 0x16;
  local_348.uvwBits.m_data[0] = 0x10;
  local_348.uvwBits.m_data[1] = 0x10;
  local_348.uvwBits.m_data[2] = 0x10;
  local_348.colorThreshold.m_data[0] = 0.0;
  local_348.colorThreshold.m_data[1] = 0.0;
  local_348.colorThreshold.m_data[2] = 0.0;
  local_348.colorThreshold.m_data[3] = 0.0;
  local_348.colorMask.m_data[0] = true;
  local_348.colorMask.m_data[1] = true;
  local_348.colorMask.m_data[2] = true;
  local_348.colorMask.m_data[3] = true;
  lodPrec.rule = RULE_VULKAN;
  lodPrec.derivateBits = 0x16;
  lodPrec.lodBits = 0x10;
  util::createSampler((Sampler *)&rnd,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapS,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapT,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter);
  local_128 = local_2f8;
  local_18c._84_8_ = local_308._M_allocated_capacity;
  pCStack_130 = (ConstPixelBufferAccess *)local_308._8_8_;
  local_18c._68_4_ = rnd.m_rnd.x;
  local_18c._72_4_ = rnd.m_rnd.y;
  local_18c._76_4_ = rnd.m_rnd.z;
  local_18c._80_4_ = rnd.m_rnd.w;
  uStack_113 = (undefined7)(CONCAT44(auStack_2f4._20_4_,auStack_2f4._16_4_) >> 8);
  local_114 = true;
  local_10c = LODMODE_EXACT;
  local_348.colorMask.m_data[1] = 0 < local_3e8.greenBits;
  local_348.colorMask.m_data[0] = 0 < local_3e8.redBits;
  local_348.colorMask.m_data[2] = 0 < local_3e8.blueBits;
  local_348.colorMask.m_data[3] = 0 < local_3e8.alphaBits;
  res.m_data[0] = -(uint)(0 < (int)(local_3e8.redBits - 2U)) & local_3e8.redBits - 2U;
  res.m_data[1] = -(uint)(0 < (int)(local_3e8.greenBits - 2U)) & local_3e8.greenBits - 2U;
  res.m_data[2] = -(uint)(0 < (int)(local_3e8.blueBits - 2U)) & local_3e8.blueBits - 2U;
  res.m_data[3] = -(uint)(0 < (int)(local_3e8.alphaBits - 2U)) & local_3e8.alphaBits - 2U;
  tcu::computeFixedPointThreshold((tcu *)&rnd,&res);
  bVar15 = CVar1 != COORDTYPE_PROJECTED;
  local_348.colorThreshold.m_data[2] = (float)rnd.m_rnd.z;
  local_348.colorThreshold.m_data[3] = (float)rnd.m_rnd.w;
  local_348.colorThreshold.m_data[0] = (float)rnd.m_rnd.x;
  local_348.colorThreshold.m_data[1] = (float)rnd.m_rnd.y;
  local_348.coordBits.m_data[2] = bVar15 + 8 + (uint)bVar15;
  lodPrec.lodBits = (uint)bVar15 * 3 + 3;
  local_348.coordBits.m_data[1] = local_348.coordBits.m_data[2];
  local_348.coordBits.m_data[0] = local_348.coordBits.m_data[2];
  local_348.uvwBits.m_data[0] = 5;
  local_348.uvwBits.m_data[1] = 5;
  local_348.uvwBits.m_data[2] = 0;
  lodPrec.derivateBits = 10;
  if ((int)((ulong)((long)gridLayout.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)gridLayout.
                         super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) < 1) {
    bVar15 = false;
    local_4c4 = 0;
  }
  else {
    uVar13 = 0;
    lVar11 = 0xc;
    local_4c4 = 0;
    do {
      uVar12 = (uint)uVar13;
      iVar7 = *(int *)((long)(gridLayout.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11 + -0xc);
      iVar2 = *(int *)((long)(gridLayout.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11 + -8);
      width = *(int *)((long)(gridLayout.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11 + -4);
      height = *(int *)((long)(gridLayout.
                               super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11);
      glu::TextureTestUtil::computeQuadTexCoordCube
                (&texCoord,uVar12 + (int)((uVar13 & 0xffffffff) / 6) * -6);
      if (CVar1 == COORDTYPE_PROJECTED) {
        local_18c._8_4_ = local_18c._8_4_ | 1;
        uVar8 = (ulong)((uVar12 & 3) << 4);
        local_18c._12_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + uVar8);
        local_18c._20_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + uVar8 + 8);
      }
      else if (CVar1 == COORDTYPE_BASIC_BIAS) {
        local_18c._8_4_ = local_18c._8_4_ | 2;
        local_18c._28_4_ = Texture2DMipmapTestInstance::iterate::s_bias[uVar12 & 7];
      }
      tcu::SurfaceAccess::SurfaceAccess
                ((SurfaceAccess *)&res,&referenceFrame,&local_3e8,iVar7,iVar2,width,height);
      iVar6 = (*(((this->m_texture).m_ptr)->super_TestTexture)._vptr_TestTexture[0x11])();
      lVar9 = CONCAT44(extraout_var,iVar6);
      auStack_2f4._12_4_ = (undefined4)*(undefined8 *)(lVar9 + 0x160);
      auStack_2f4._16_4_ = (undefined4)((ulong)*(undefined8 *)(lVar9 + 0x160) >> 0x20);
      rnd.m_rnd._0_8_ = *(undefined8 *)(lVar9 + 0x130);
      rnd.m_rnd._8_8_ = *(undefined8 *)(lVar9 + 0x138);
      local_308._M_allocated_capacity = *(undefined8 *)(lVar9 + 0x140);
      local_308._8_8_ = *(undefined8 *)(lVar9 + 0x148);
      local_2f8 = (int)*(undefined8 *)(lVar9 + 0x150);
      auStack_2f4._0_4_ = (undefined4)((ulong)*(undefined8 *)(lVar9 + 0x150) >> 0x20);
      auStack_2f4._4_4_ = (undefined4)*(undefined8 *)(lVar9 + 0x158);
      auStack_2f4._8_4_ = (undefined4)((ulong)*(undefined8 *)(lVar9 + 0x158) >> 0x20);
      glu::TextureTestUtil::sampleTexture
                ((SurfaceAccess *)&res,(TextureCubeView *)&rnd,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,(ReferenceParams *)local_18c);
      rnd.m_rnd.x = 8;
      rnd.m_rnd.y = 3;
      pvVar14 = (void *)renderedFrame.m_pixels.m_cap;
      if (renderedFrame.m_pixels.m_cap != 0) {
        pvVar14 = renderedFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_450,(TextureFormat *)&rnd,renderedFrame.m_width,
                 renderedFrame.m_height,1,pvVar14);
      tcu::getSubregion((PixelBufferAccess *)&res,(PixelBufferAccess *)local_450,iVar7,iVar2,width,
                        height);
      rnd.m_rnd.x = 8;
      rnd.m_rnd.y = 3;
      pvVar14 = (void *)referenceFrame.m_pixels.m_cap;
      if (referenceFrame.m_pixels.m_cap != 0) {
        pvVar14 = referenceFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_3d0,(TextureFormat *)&rnd,referenceFrame.m_width,
                 referenceFrame.m_height,1,pvVar14);
      tcu::getSubregion((PixelBufferAccess *)local_488,(PixelBufferAccess *)local_3d0,iVar7,iVar2,
                        width,height);
      rnd.m_rnd.x = 8;
      rnd.m_rnd.y = 3;
      pvVar14 = (void *)errorMask.m_pixels.m_cap;
      if (errorMask.m_pixels.m_cap != 0) {
        pvVar14 = errorMask.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                (&local_58,(TextureFormat *)&rnd,errorMask.m_width,errorMask.m_height,1,pvVar14);
      tcu::getSubregion((PixelBufferAccess *)local_410,&local_58,iVar7,iVar2,width,height);
      iVar7 = (*(((this->m_texture).m_ptr)->super_TestTexture)._vptr_TestTexture[0x11])();
      lVar9 = CONCAT44(extraout_var_00,iVar7);
      auStack_2f4._12_4_ = (undefined4)*(undefined8 *)(lVar9 + 0x160);
      auStack_2f4._16_4_ = (undefined4)((ulong)*(undefined8 *)(lVar9 + 0x160) >> 0x20);
      rnd.m_rnd._0_8_ = *(undefined8 *)(lVar9 + 0x130);
      rnd.m_rnd._8_8_ = *(undefined8 *)(lVar9 + 0x138);
      local_308._M_allocated_capacity = *(long *)(lVar9 + 0x140);
      local_308._8_8_ = *(undefined8 *)(lVar9 + 0x148);
      local_2f8 = (int)*(undefined8 *)(lVar9 + 0x150);
      auStack_2f4._0_4_ = (undefined4)((ulong)*(undefined8 *)(lVar9 + 0x150) >> 0x20);
      auStack_2f4._4_4_ = (undefined4)*(undefined8 *)(lVar9 + 0x158);
      auStack_2f4._8_4_ = (undefined4)((ulong)*(undefined8 *)(lVar9 + 0x158) >> 0x20);
      iVar7 = glu::TextureTestUtil::computeTextureLookupDiff
                        ((ConstPixelBufferAccess *)&res,(ConstPixelBufferAccess *)local_488,
                         (PixelBufferAccess *)local_410,(TextureCubeView *)&rnd,
                         texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start,(ReferenceParams *)local_18c,&local_348,
                         &lodPrec,((this->super_TestInstance).m_context)->m_testCtx->m_watchDog);
      local_4c4 = local_4c4 + iVar7;
      uVar13 = uVar13 + 1;
      lVar11 = lVar11 + 0x10;
    } while ((long)uVar13 <
             (long)(int)((ulong)((long)gridLayout.
                                       super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)gridLayout.
                                      super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4));
    if (local_4c4 < 1) {
      bVar15 = false;
    }
    else {
      rnd.m_rnd._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
      this_01 = &rnd.m_rnd.z;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01,"ERROR: Image verification failed, found ",0x28);
      std::ostream::operator<<(this_01,local_4c4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," invalid pixels!",0x10)
      ;
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
      std::ios_base::~ios_base(local_2a0);
      local_4c4 = 1;
      bVar15 = true;
    }
  }
  pTVar3 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_450._0_8_ = (long)local_450 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"Result","");
  local_488._0_8_ = (long)local_488 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"Verification result","");
  tcu::LogImageSet::LogImageSet((LogImageSet *)&res,(string *)local_450,(string *)local_488);
  tcu::TestLog::startImageSet(pTVar3,(char *)CONCAT44(res.m_data[1],res.m_data[0]),local_d8._M_p);
  local_3d0._0_8_ = (long)local_3d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"Rendered","");
  local_410._0_8_ = (long)local_410 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"Rendered image","");
  pSVar10 = &renderedFrame;
  tcu::LogImage::LogImage
            ((LogImage *)&rnd,(string *)local_3d0,(string *)local_410,pSVar10,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)&rnd,(int)pTVar3,__buf,(size_t)pSVar10);
  if ((undefined1 *)CONCAT44(auStack_2f4._0_4_,local_2f8) != auStack_2f4 + 0xc) {
    operator_delete((undefined1 *)CONCAT44(auStack_2f4._0_4_,local_2f8),
                    CONCAT44(auStack_2f4._16_4_,auStack_2f4._12_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rnd.m_rnd._0_8_ != &local_308) {
    operator_delete((void *)rnd.m_rnd._0_8_,(ulong)(local_308._M_allocated_capacity + 1));
  }
  if (local_410._0_8_ != (long)local_410 + 0x10) {
    operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
  }
  if (local_3d0._0_8_ != (long)local_3d0 + 0x10) {
    operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_p != local_c8) {
    operator_delete(local_d8._M_p,local_c8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(res.m_data[1],res.m_data[0]) != &local_e8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(res.m_data[1],res.m_data[0]),local_e8._M_allocated_capacity + 1);
  }
  if (local_488._0_8_ != (long)local_488 + 0x10) {
    operator_delete((void *)local_488._0_8_,local_488._16_8_ + 1);
  }
  if (local_450._0_8_ != (long)local_450 + 0x10) {
    operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
  }
  if (bVar15) {
    pTVar3 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    local_450._0_8_ = (long)local_450 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"Reference","");
    local_488._0_8_ = (long)local_488 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"Ideal reference","");
    pSVar10 = &referenceFrame;
    tcu::LogImage::LogImage
              ((LogImage *)&rnd,(string *)local_450,(string *)local_488,pSVar10,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    iVar7 = (int)pTVar3;
    tcu::LogImage::write((LogImage *)&rnd,iVar7,__buf_00,(size_t)pSVar10);
    local_3d0._0_8_ = (long)local_3d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"ErrorMask","");
    local_410._0_8_ = (long)local_410 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"Error mask","");
    pSVar10 = &errorMask;
    tcu::LogImage::LogImage
              ((LogImage *)&res,(string *)local_3d0,(string *)local_410,pSVar10,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&res,iVar7,__buf_01,(size_t)pSVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_p != local_c8) {
      operator_delete(local_d8._M_p,local_c8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(res.m_data[1],res.m_data[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(res.m_data[1],res.m_data[0]),local_e8._M_allocated_capacity + 1);
    }
    if (local_410._0_8_ != (long)local_410 + 0x10) {
      operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
    }
    if (local_3d0._0_8_ != (long)local_3d0 + 0x10) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    if ((undefined1 *)CONCAT44(auStack_2f4._0_4_,local_2f8) != auStack_2f4 + 0xc) {
      operator_delete((undefined1 *)CONCAT44(auStack_2f4._0_4_,local_2f8),
                      CONCAT44(auStack_2f4._16_4_,auStack_2f4._12_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rnd.m_rnd._0_8_ != &local_308) {
      operator_delete((void *)rnd.m_rnd._0_8_,(ulong)(local_308._M_allocated_capacity + 1));
    }
    if (local_488._0_8_ != (long)local_488 + 0x10) {
      operator_delete((void *)local_488._0_8_,local_488._16_8_ + 1);
    }
    if (local_450._0_8_ != (long)local_450 + 0x10) {
      operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
    }
  }
  tcu::TestLog::endImageSet(((this->super_TestInstance).m_context)->m_testCtx->m_log);
  rnd.m_rnd._0_8_ = &local_308;
  if (local_4c4 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&rnd,"pass","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,rnd.m_rnd._0_8_,
               rnd.m_rnd._8_8_ + rnd.m_rnd._0_8_);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&rnd,"fail","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,rnd.m_rnd._0_8_,
               rnd.m_rnd._8_8_ + rnd.m_rnd._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rnd.m_rnd._0_8_ != &local_308) {
    operator_delete((void *)rnd.m_rnd._0_8_,(ulong)(local_308._M_allocated_capacity + 1));
  }
  tcu::Surface::~Surface(&errorMask);
  tcu::Surface::~Surface(&referenceFrame);
  if (gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(gridLayout.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)gridLayout.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)gridLayout.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&renderedFrame);
  if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus TextureCubeMipmapTestInstance::iterate (void)
{
	const int			viewportWidth	= m_renderer.getRenderWidth();
	const int			viewportHeight	= m_renderer.getRenderHeight();

	const bool			isProjected		= m_testParameters.coordType == COORDTYPE_PROJECTED;
	const bool			useLodBias		= m_testParameters.coordType == COORDTYPE_BASIC_BIAS;

	ReferenceParams		refParams		(TEXTURETYPE_CUBE);
	vector<float>		texCoord;
	tcu::Surface		renderedFrame	(viewportWidth, viewportHeight);

	refParams.sampler		= util::createSampler(m_testParameters.wrapS, m_testParameters.wrapT, m_testParameters.minFilter, m_testParameters.magFilter);
	refParams.samplerType	= getSamplerType(vk::mapVkFormat(m_testParameters.format));
	refParams.flags			= (isProjected ? ReferenceParams::PROJECTED : 0) | (useLodBias ? ReferenceParams::USE_BIAS : 0);
	refParams.lodMode		= LODMODE_EXACT; // Use ideal lod.

	// Compute grid.
	vector<IVec4> gridLayout;
	computeGridLayout(gridLayout, viewportWidth, viewportHeight);

	// Bias values.
	static const float s_bias[] = { 1.0f, -2.0f, 0.8f, -0.5f, 1.5f, 0.9f, 2.0f, 4.0f };

	// Projection values \note Less agressive than in 2D case due to smaller quads.
	static const Vec4 s_projections[] =
	{
		Vec4(1.2f, 1.0f, 0.7f, 1.0f),
		Vec4(1.3f, 0.8f, 0.6f, 1.1f),
		Vec4(0.8f, 1.0f, 1.2f, 0.8f),
		Vec4(1.2f, 1.0f, 1.3f, 0.9f)
	};

	// Render with GL
	for (int cellNdx = 0; cellNdx < (int)gridLayout.size(); cellNdx++)
	{
		const float			curX		= (float)gridLayout[cellNdx].x();
		const float			curY		= (float)gridLayout[cellNdx].y();
		const float			curW		= (float)gridLayout[cellNdx].z();
		const float			curH		= (float)gridLayout[cellNdx].w();
		const tcu::CubeFace	cubeFace	= (tcu::CubeFace)(cellNdx % tcu::CUBEFACE_LAST);

		DE_ASSERT(m_testParameters.coordType != COORDTYPE_AFFINE); // Not supported.
		computeQuadTexCoordCube(texCoord, cubeFace);

		if (isProjected)
		{
			refParams.flags	|= ReferenceParams::PROJECTED;
			refParams.w		 = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];
		}

		if (useLodBias)
		{
			refParams.flags	|= ReferenceParams::USE_BIAS;
			refParams.bias	 = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];
		}

		// Render
		m_renderer.setViewport(curX, curY, curW, curH);
		m_renderer.renderQuad(renderedFrame, 0, &texCoord[0], refParams);
	}

	// Render reference and compare
	{
		const tcu::IVec4		formatBitDepth		= getTextureFormatBitDepth(vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
		const tcu::PixelFormat	pixelFormat			(formatBitDepth[0], formatBitDepth[1], formatBitDepth[2], formatBitDepth[3]);
		tcu::Surface			referenceFrame		(viewportWidth, viewportHeight);
		tcu::Surface			errorMask			(viewportWidth, viewportHeight);
		int						numFailedPixels		= 0;
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec				(tcu::LodPrecision::RULE_VULKAN);

		// Params for rendering reference
		refParams.sampler					= util::createSampler(m_testParameters.wrapS, m_testParameters.wrapT, m_testParameters.minFilter, m_testParameters.magFilter);
		refParams.sampler.seamlessCubeMap	= true;
		refParams.lodMode					= LODMODE_EXACT;

		// Comparison parameters
		lookupPrec.colorMask		= getCompareMask(pixelFormat);
		lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat)-2, tcu::IVec4(0)));
		lookupPrec.coordBits		= isProjected ? tcu::IVec3(8) : tcu::IVec3(10);
		lookupPrec.uvwBits			= tcu::IVec3(5,5,0);
		lodPrec.derivateBits		= 10;
		lodPrec.lodBits				= isProjected ? 3 : 6;

		for (int cellNdx = 0; cellNdx < (int)gridLayout.size(); cellNdx++)
		{
			const int				curX		= gridLayout[cellNdx].x();
			const int				curY		= gridLayout[cellNdx].y();
			const int				curW		= gridLayout[cellNdx].z();
			const int				curH		= gridLayout[cellNdx].w();
			const tcu::CubeFace		cubeFace	= (tcu::CubeFace)(cellNdx % tcu::CUBEFACE_LAST);

			DE_ASSERT(m_testParameters.coordType != COORDTYPE_AFFINE); // Not supported.
			computeQuadTexCoordCube(texCoord, cubeFace);

			if (isProjected)
			{
				refParams.flags	|= ReferenceParams::PROJECTED;
				refParams.w		 = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];
			}

			if (useLodBias)
			{
				refParams.flags	|= ReferenceParams::USE_BIAS;
				refParams.bias	 = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];
			}

			// Render ideal reference.
			{
				tcu::SurfaceAccess idealDst(referenceFrame, pixelFormat, curX, curY, curW, curH);
				sampleTexture(idealDst, m_texture->getTexture(), &texCoord[0], refParams);
			}

			// Compare this cell
			numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
														tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
														tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
														m_texture->getTexture(), &texCoord[0], refParams,
														lookupPrec, lodPrec, m_context.getTestContext().getWatchDog());
		}

		if (numFailedPixels > 0)
		{
			m_context.getTestContext().getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;
		}

		m_context.getTestContext().getLog() << TestLog::ImageSet("Result", "Verification result")
											<< TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_context.getTestContext().getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
												<< TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_context.getTestContext().getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			return isOk ? tcu::TestStatus::pass("pass") : tcu::TestStatus::fail("fail");
		}
	}
}